

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O3

int __thiscall TPZPolynomial::SetRoots(TPZPolynomial *this)

{
  double dVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  double *pdVar7;
  double dVar8;
  int iVar9;
  int iVar11;
  REAL RVar10;
  double dVar12;
  double dVar13;
  double dVar14;
  TPZManVector<double,_3> X;
  TPZManVector<double,_3> local_58;
  
  TPZManVector<double,_3>::TPZManVector(&local_58,3);
  pdVar7 = (this->fCo).fStore;
  dVar1 = this->fTolerance;
  iVar9 = 0;
  iVar11 = 0;
  lVar4 = 0;
  do {
    iVar9 = iVar9 + (uint)(ABS(pdVar7[lVar4]) < dVar1);
    iVar11 = iVar11 + (uint)(ABS((pdVar7 + lVar4)[1]) < dVar1);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 4);
  if (iVar11 + iVar9 == 4) {
    pdVar7 = (this->fReal).fStore;
    *pdVar7 = 0.0;
    pdVar7[1] = 0.0;
    pdVar7[2] = 0.0;
    iVar9 = 1;
  }
  else if ((dVar1 <= ABS(*pdVar7)) || (dVar1 <= ABS(pdVar7[1]))) {
    *local_58.super_TPZVec<double>.fStore = -99.999;
    local_58.super_TPZVec<double>.fStore[1] = -99.999;
    local_58.super_TPZVec<double>.fStore[2] = -99.999;
    RVar10 = this->fTolerance;
    uVar5 = 0;
    dVar1 = pdVar7[2] + 1.0;
    do {
      dVar14 = pdVar7[2];
      dVar12 = pdVar7[3] * 3.0 * dVar1 * dVar1 + (dVar14 + dVar14) * dVar1 + pdVar7[1];
      if (RVar10 <= ABS(dVar12)) {
        uVar5 = uVar5 + 1;
        dVar14 = dVar1 - (pdVar7[1] * dVar1 +
                          pdVar7[3] * dVar1 * dVar1 * dVar1 + dVar14 * dVar1 * dVar1 + *pdVar7) /
                         dVar12;
        *local_58.super_TPZVec<double>.fStore = dVar14;
        RVar10 = this->fTolerance;
      }
      else {
        dVar14 = *local_58.super_TPZVec<double>.fStore;
        uVar5 = 0x2712;
      }
      uVar6 = 0x2711;
      if (RVar10 < ABS(dVar1 - dVar14)) {
        uVar6 = uVar5;
      }
      dVar1 = dVar14;
    } while ((int)uVar6 < 10000);
    if ((uVar6 & 0x7ffffffd) == 10000) {
      uVar5 = 0;
      dVar1 = dVar14 * -100000.0;
      do {
        dVar12 = pdVar7[2];
        dVar13 = pdVar7[3] * 3.0 * dVar1 * dVar1 + (dVar12 + dVar12) * dVar1 + pdVar7[1];
        uVar6 = 0x2712;
        if (RVar10 < ABS(dVar13)) {
          uVar6 = uVar5 + 1;
          dVar14 = dVar1 - (pdVar7[1] * dVar1 +
                            pdVar7[3] * dVar1 * dVar1 * dVar1 + dVar12 * dVar1 * dVar1 + *pdVar7) /
                           dVar13;
          *local_58.super_TPZVec<double>.fStore = dVar14;
          RVar10 = this->fTolerance;
        }
        uVar5 = 0x3e9;
        if (RVar10 < ABS(dVar1 - dVar14)) {
          uVar5 = uVar6;
        }
        dVar1 = dVar14;
      } while ((int)uVar5 < 10000);
    }
    if ((uVar6 & 0x7ffffffd) == 10000) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= ",0x3e);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,uVar6);
      iVar9 = -1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    else {
      dVar1 = pdVar7[3];
      dVar12 = pdVar7[2];
      dVar13 = *pdVar7;
      dVar8 = pdVar7[1];
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Resultado da 1a raiz na equacao",0x1f);
      poVar3 = std::ostream::_M_insert<double>
                         (dVar13 + dVar8 * dVar14 +
                                   dVar1 * dVar14 * dVar14 * dVar14 + dVar12 * dVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      pdVar7 = (this->fCo).fStore;
      dVar1 = pdVar7[3];
      dVar14 = *local_58.super_TPZVec<double>.fStore * dVar1 + pdVar7[2];
      dVar12 = *local_58.super_TPZVec<double>.fStore * dVar14 + pdVar7[1];
      dVar13 = dVar14 * dVar14 + dVar12 * -4.0 * dVar1;
      if (0.0 <= dVar13) {
        uVar2 = (ulong)DAT_014d2310;
        dVar12 = SQRT(dVar13);
        dVar8 = dVar12;
        if (dVar13 < 0.0) {
          dVar8 = sqrt(dVar13);
        }
        local_58.super_TPZVec<double>.fStore[1] =
             ((double)(uVar2 ^ (ulong)dVar14) - dVar8) / (dVar1 + dVar1);
        if (dVar13 < 0.0) {
          dVar12 = sqrt(dVar13);
        }
        local_58.super_TPZVec<double>.fStore[2] = (dVar12 - dVar14) / (dVar1 + dVar1);
        pdVar7 = local_58.super_TPZVec<double>.fStore + 3;
        std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                  (local_58.super_TPZVec<double>.fStore,pdVar7,2);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =",0x3f);
        poVar3 = std::ostream::_M_insert<double>(dVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
        poVar3 = std::ostream::_M_insert<double>(*local_58.super_TPZVec<double>.fStore);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        poVar3 = std::ostream::_M_insert<double>((this->fCo).fStore[3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x >= + ",7);
        poVar3 = std::ostream::_M_insert<double>((this->fCo).fStore[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x <= + ",7);
        poVar3 = std::ostream::_M_insert<double>((this->fCo).fStore[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x + ",4);
        poVar3 = std::ostream::_M_insert<double>(*(this->fCo).fStore);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = 0.0\n",7);
        poVar3 = std::ostream::_M_insert<double>(dVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x<= + ",6);
        poVar3 = std::ostream::_M_insert<double>(dVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x + ",4);
        poVar3 = std::ostream::_M_insert<double>(dVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = 0.0\n",7);
        pdVar7 = local_58.super_TPZVec<double>.fStore + 3;
        local_58.super_TPZVec<double>.fStore[1] = 0.0;
        local_58.super_TPZVec<double>.fStore[2] = 0.0;
        std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                  (local_58.super_TPZVec<double>.fStore,pdVar7,2);
      }
      std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                (local_58.super_TPZVec<double>.fStore,pdVar7);
      iVar9 = 1;
      TPZVec<double>::operator=(&this->fReal,&local_58.super_TPZVec<double>);
    }
  }
  else {
    *local_58.super_TPZVec<double>.fStore = pdVar7[2] / pdVar7[3];
    local_58.super_TPZVec<double>.fStore[1] = 0.0;
    local_58.super_TPZVec<double>.fStore[2] = 0.0;
    std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
              (local_58.super_TPZVec<double>.fStore,local_58.super_TPZVec<double>.fStore + 3,2);
    std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
              (local_58.super_TPZVec<double>.fStore,local_58.super_TPZVec<double>.fStore + 3);
    iVar9 = 1;
    TPZVec<double>::operator=(&this->fReal,&local_58.super_TPZVec<double>);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_58);
  return iVar9;
}

Assistant:

int TPZPolynomial::SetRoots() {
    TPZManVector<REAL,3> X(3);
	REAL x;
    REAL tol = -99.999;
    REAL der;
    int i, j;
    int zero = 0;
    for (i = 0; i < 4; i++)
        if (fabs(fCo[i]) < fTolerance) zero++;
    if (zero == 4) {
        for (i = 0; i < 3; i++) fReal[i] = 0.000;
        return 1;
    }
    else {
        if (fabs(fCo[0]) < fTolerance && fabs(fCo[1]) < fTolerance) {
            X[0] = fCo[2] / fCo[3];
            X[1] = 0.0;
            X[2] = 0.0;
			sort(&X[0], &X[3], greater<REAL>());
			fReal = X;
//			copy(&X[0], &X[3], &fReal[0]);
        }
        else {
            // Primeira aproximacao
            for (i = 0; i < 3; i++) X[i] = -99.999;
            x = fCo[2] + 1.0;
            j = 0;
            while (j < 10000) {
                j++;
                der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                if (fabs(der) < fTolerance) j = 10002;
                else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                tol = fabs(x - X[0]);
                if (tol <= fTolerance) j = 10001;
                x = X[0];
            }
            //Caso falhe a primeira aproxima��o
            if (j == 10002 || j == 10000) {
                x = -1e5 * x;
                j = 0;
                while (j < 10000) {
                    j++;
                    der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                    if (fabs(der) <= fTolerance) j = 10002;
                    else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                    tol = fabs(x - X[0]);
                    if (tol <= fTolerance) j = 1001;
                    x = X[0];
                }
            }
            if (j == 10002 || j == 10000) {
                cout << "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= " << j << "\n";
                return -1;
            }
            REAL teste;
            teste = fCo[3] * X[0] * X[0] * X[0] + fCo[2] * X[0] + fCo[1] * X[0] + fCo[0];
            cout << "Resultado da 1a raiz na equacao" << teste << "\n";
            //Fim do calculo da primeira raiz (X[0])
            //Reducao da equacao caracteristica de grau 2.
			REAL  b1, b2, b3;
			b3 = fCo[3];
			b2 = fCo[2] + X[0] * b3;
			b1 = fCo[1] + X[0] * b2;
			
            /** Calculo das outras duas raizes (X[1] e X[2]) b3*x^2 + b2*x + b1 = 0 */
            REAL delta;
            delta = b2 * b2 - 4.0 * b1 * b3;
            if (delta < 0.0) {
                cerr << "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =" << delta << "\t" << X[0] << "\n";
                cout << fCo[3] << "x >= + " << fCo[2] << "x <= + " << fCo[1] << "x + " << fCo[0] << " = 0.0\n";
                cout << b3 << "x<= + " << b2 << "x + " << b1 << " = 0.0\n";
                X[1] = 0.0;
                X[2] = 0.0;
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
            else {
                X[1] = (-b2 - sqrt(delta)) / (2.0 * b3);
                X[2] = (-b2 + sqrt(delta)) / (2.0 * b3);
                // Ordenando as tensoes de forma crescente
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
        }
    }
    return 1;
}